

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O3

ssize_t __thiscall
boost::deflate::inflate_stream_test::ZlibDecompressor::write
          (ZlibDecompressor *this,int __fd,void *__buf,size_t __n)

{
  char *__s1;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  undefined8 *puVar4;
  runtime_error *this_00;
  ulong uVar5;
  error_code eVar6;
  
  uVar1 = inflate(&this->zs,write::zlib_flushes[__fd]);
  switch(uVar1) {
  case 0:
    uVar3 = (ulong)uVar1;
    uVar5 = uVar3;
    goto LAB_0010ae61;
  case 1:
    eVar6 = make_error_code(end_of_stream);
    uVar3 = eVar6._0_8_;
    break;
  case 2:
    eVar6 = make_error_code(need_dict);
    uVar3 = eVar6._0_8_;
    break;
  case 0xfffffffb:
    eVar6 = make_error_code(need_buffers);
    uVar3 = eVar6._0_8_;
    break;
  case 0xfffffffc:
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = std::ios::widen;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  case 0xfffffffd:
    __s1 = (this->zs).msg;
    if (__s1 == (char *)0x0) goto switchD_0010ac8d_caseD_fffffffe;
    iVar2 = strcmp(__s1,"invalid stored block lengths");
    if (iVar2 == 0) {
      eVar6 = make_error_code(invalid_stored_length);
      uVar3 = eVar6._0_8_;
    }
    else {
      iVar2 = strcmp(__s1,"invalid block type");
      if (iVar2 == 0) {
        eVar6 = make_error_code(invalid_block_type);
        uVar3 = eVar6._0_8_;
      }
      else {
        iVar2 = strcmp(__s1,"too many length or distance symbols");
        if (iVar2 == 0) {
          eVar6 = make_error_code(too_many_symbols);
          uVar3 = eVar6._0_8_;
        }
        else {
          iVar2 = strcmp(__s1,"invalid code lengths set");
          if (iVar2 == 0) {
            eVar6 = make_error_code(incomplete_length_set);
            uVar3 = eVar6._0_8_;
          }
          else {
            iVar2 = strcmp(__s1,"invalid literal/lengths set");
            if (iVar2 == 0) {
              eVar6 = make_error_code(over_subscribed_length);
              uVar3 = eVar6._0_8_;
            }
            else {
              iVar2 = strcmp(__s1,"invalid literal/length code");
              if (iVar2 == 0) {
                eVar6 = make_error_code(invalid_literal_length);
                uVar3 = eVar6._0_8_;
              }
              else {
                iVar2 = strcmp(__s1,"invalid distance code");
                if (iVar2 == 0) {
                  eVar6 = make_error_code(invalid_distance_code);
                  uVar3 = eVar6._0_8_;
                }
                else {
                  iVar2 = strcmp(__s1,"invalid distance too far back");
                  if (iVar2 == 0) {
                    eVar6 = make_error_code(invalid_distance);
                    uVar3 = eVar6._0_8_;
                  }
                  else {
                    iVar2 = strcmp(__s1,"invalid bit length repeat");
                    if (iVar2 == 0) {
                      eVar6 = make_error_code(invalid_bit_length_repeat);
                      uVar3 = eVar6._0_8_;
                    }
                    else {
                      iVar2 = strcmp(__s1,"invalid code -- missing end-of-block");
                      if (iVar2 == 0) {
                        eVar6 = make_error_code(missing_eob);
                        uVar3 = eVar6._0_8_;
                      }
                      else {
                        iVar2 = strcmp(__s1,"unknown compression method");
                        if (iVar2 == 0) {
                          eVar6 = make_error_code(unknown_compression_method);
                          uVar3 = eVar6._0_8_;
                        }
                        else {
                          iVar2 = strcmp(__s1,"invalid window size");
                          if (iVar2 == 0) {
                            eVar6 = make_error_code(invalid_window_size);
                            uVar3 = eVar6._0_8_;
                          }
                          else {
                            iVar2 = strcmp(__s1,"incorrect header check");
                            if (iVar2 == 0) {
                              eVar6 = make_error_code(incorrect_header_check);
                              uVar3 = eVar6._0_8_;
                            }
                            else {
                              iVar2 = strcmp(__s1,"incorrect data check");
                              if (iVar2 == 0) {
                                eVar6 = make_error_code(incorrect_data_check);
                                uVar3 = eVar6._0_8_;
                              }
                              else {
                                iVar2 = strcmp(__s1,"incorrect length check");
                                if (iVar2 == 0) {
                                  eVar6 = make_error_code(incorrect_length_check);
                                  uVar3 = eVar6._0_8_;
                                }
                                else {
                                  iVar2 = strcmp(__s1,"header crc mismatch");
                                  if (iVar2 == 0) {
                                    eVar6 = make_error_code(header_crc_mismatch);
                                    uVar3 = eVar6._0_8_;
                                  }
                                  else {
                                    iVar2 = strcmp(__s1,"unknown header flags set");
                                    if (iVar2 != 0) goto switchD_0010ac8d_caseD_fffffffe;
                                    eVar6 = make_error_code(unknown_header_flags);
                                    uVar3 = eVar6._0_8_;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    break;
  case 0xfffffffe:
switchD_0010ac8d_caseD_fffffffe:
    eVar6 = make_error_code(stream_error);
    uVar3 = eVar6._0_8_;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"zlib decompressor: impossible value");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar5 = uVar3 & 0xffffff0000000000;
LAB_0010ae61:
  return uVar3 & 0xffffffffff | uVar5;
}

Assistant:

error_code write(Flush flush) override {
            constexpr static int zlib_flushes[] = {0, Z_BLOCK, Z_PARTIAL_FLUSH, Z_SYNC_FLUSH, Z_FULL_FLUSH, Z_FINISH, Z_TREES};
            const auto zlib_flush = zlib_flushes[static_cast<int>(flush)];
            const auto res = ::inflate(&zs, zlib_flush);
            switch(res){
            case Z_OK:
              return {};
            case Z_STREAM_END:
              return error::end_of_stream;
            case Z_NEED_DICT:
              return error::need_dict;
            case Z_DATA_ERROR:
                if(zs.msg && !std::strcmp(zs.msg, "invalid stored block lengths"))
                    return error::invalid_stored_length;
                if(zs.msg && !std::strcmp(zs.msg, "invalid block type"))
                    return error::invalid_block_type;
                if(zs.msg && !std::strcmp(zs.msg, "too many length or distance symbols"))
                    return error::too_many_symbols;
                if(zs.msg && !std::strcmp(zs.msg, "invalid code lengths set"))
                    return error::incomplete_length_set;
                if(zs.msg && !std::strcmp(zs.msg, "invalid literal/lengths set"))
                    return error::over_subscribed_length;
                if(zs.msg && !std::strcmp(zs.msg, "invalid literal/length code"))
                    return error::invalid_literal_length;
                if(zs.msg && !std::strcmp(zs.msg, "invalid distance code"))
                    return error::invalid_distance_code;
                if(zs.msg && !std::strcmp(zs.msg, "invalid distance too far back"))
                    return error::invalid_distance;
                if(zs.msg && !std::strcmp(zs.msg, "invalid bit length repeat"))
                    return error::invalid_bit_length_repeat;
                if(zs.msg && !std::strcmp(zs.msg, "invalid code -- missing end-of-block"))
                    return error::missing_eob;
                if(zs.msg && !std::strcmp(zs.msg, "unknown compression method"))
                    return error::unknown_compression_method;
                if(zs.msg && !std::strcmp(zs.msg, "invalid window size"))
                        return error::invalid_window_size;
                if(zs.msg && !std::strcmp(zs.msg, "incorrect header check"))
                        return error::incorrect_header_check;
                if(zs.msg && !std::strcmp(zs.msg, "incorrect data check"))
                    return error::incorrect_data_check;
                if(zs.msg && !std::strcmp(zs.msg, "incorrect length check"))
                    return error::incorrect_length_check;
                if(zs.msg && !std::strcmp(zs.msg, "header crc mismatch"))
                    return error::header_crc_mismatch;
                if(zs.msg && !std::strcmp(zs.msg, "unknown header flags set"))
                    return error::unknown_header_flags;
                BOOST_FALLTHROUGH;
            case Z_STREAM_ERROR:
              return error::stream_error;
            case Z_MEM_ERROR:
              throw std::bad_alloc{};
            case Z_BUF_ERROR:
              return error::need_buffers;
            default:
              throw std::runtime_error{"zlib decompressor: impossible value"};
            }
        }